

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O3

void __thiscall
Apple::II::Video::VideoBase::output_double_low_resolution
          (VideoBase *this,uint8_t *target,uint8_t *source,uint8_t *auxiliary_source,size_t length,
          int column,int row)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  size_t sVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  
  if (length != 0) {
    bVar1 = (byte)row & 4;
    pbVar3 = target + 0xd;
    sVar4 = 0;
    do {
      bVar9 = (column + (int)sVar4 & 1U) == 0;
      bVar8 = !bVar9 * '\x03' + 1;
      bVar2 = 8;
      if (bVar9) {
        bVar2 = 2;
      }
      bVar6 = bVar9 * '\x03' + 1;
      bVar7 = 2;
      if (bVar9) {
        bVar7 = 8;
      }
      bVar5 = auxiliary_source[sVar4] >> bVar1 & bVar8;
      pbVar3[-9] = bVar5;
      pbVar3[-0xd] = bVar5;
      bVar5 = auxiliary_source[sVar4] >> bVar1 & bVar2;
      pbVar3[-8] = bVar5;
      pbVar3[-0xc] = bVar5;
      bVar5 = auxiliary_source[sVar4] >> bVar1 & bVar6;
      pbVar3[-7] = bVar5;
      pbVar3[-0xb] = bVar5;
      pbVar3[-10] = auxiliary_source[sVar4] >> bVar1 & bVar7;
      bVar5 = source[sVar4] >> bVar1 & bVar2;
      pbVar3[-1] = bVar5;
      pbVar3[-5] = bVar5;
      bVar6 = source[sVar4] >> bVar1 & bVar6;
      *pbVar3 = bVar6;
      pbVar3[-4] = bVar6;
      pbVar3[-3] = source[sVar4] >> bVar1 & bVar7;
      bVar8 = source[sVar4] >> bVar1 & bVar8;
      pbVar3[-2] = bVar8;
      pbVar3[-6] = bVar8;
      this->graphics_carry_ = source[sVar4] >> bVar1 & bVar2;
      sVar4 = sVar4 + 1;
      pbVar3 = pbVar3 + 0xe;
    } while (length != sVar4);
  }
  return;
}

Assistant:

void VideoBase::output_double_low_resolution(uint8_t *target, const uint8_t *const source, const uint8_t *const auxiliary_source, size_t length, int column, int row) const {
	const int row_shift = row&4;
	for(size_t c = 0; c < length; ++c) {
		if((column + int(c))&1) {
			target[0] = target[4] = (auxiliary_source[c] >> row_shift) & 4;
			target[1] = target[5] = (auxiliary_source[c] >> row_shift) & 8;
			target[2] = target[6] = (auxiliary_source[c] >> row_shift) & 1;
			target[3] = (auxiliary_source[c] >> row_shift) & 2;

			target[8] = target[12] = (source[c] >> row_shift) & 8;
			target[9] = target[13] = (source[c] >> row_shift) & 1;
			target[10] = (source[c] >> row_shift) & 2;
			target[7] = target[11] = (source[c] >> row_shift) & 4;
			graphics_carry_ = (source[c] >> row_shift) & 8;
		} else {
			target[0] = target[4] = (auxiliary_source[c] >> row_shift) & 1;
			target[1] = target[5] = (auxiliary_source[c] >> row_shift) & 2;
			target[2] = target[6] = (auxiliary_source[c] >> row_shift) & 4;
			target[3] = (auxiliary_source[c] >> row_shift) & 8;

			target[8] = target[12] = (source[c] >> row_shift) & 2;
			target[9] = target[13] = (source[c] >> row_shift) & 4;
			target[10] = (source[c] >> row_shift) & 8;
			target[7] = target[11] = (source[c] >> row_shift) & 1;
			graphics_carry_ = (source[c] >> row_shift) & 2;
		}
		target += 14;
	}
}